

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_MRS_v7m(DisasContext_conflict1 *s,arg_MRS_v7m *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 retval;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_MRS_v7m *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,9);
  if (iVar1 != 0) {
    retval = tcg_const_i32_aarch64(tcg_ctx_00,a->sysm);
    gen_helper_v7m_mrs(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,retval);
    store_reg(s,a->rd,retval);
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_MRS_v7m(DisasContext *s, arg_MRS_v7m *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    tmp = tcg_const_i32(tcg_ctx, a->sysm);
    gen_helper_v7m_mrs(tcg_ctx, tmp, tcg_ctx->cpu_env, tmp);
    store_reg(s, a->rd, tmp);
    return true;
}